

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O3

byte * __thiscall
Js::ByteCodeBufferReader::ReadAsmJsConstantsTable
          (ByteCodeBufferReader *this,byte *current,FunctionBody *function)

{
  uint uVar1;
  WriteBarrierPtr<void> *pWVar2;
  code *pcVar3;
  bool bVar4;
  uint32 uVar5;
  uint32 uVar6;
  AsmJsFunctionInfo *this_00;
  TypedSlotInfo *pTVar7;
  undefined4 *puVar8;
  Types type;
  uint lineNumber;
  ulong uVar9;
  WriteBarrierPtr<void> *value;
  int iVar10;
  byte *remainingBytes;
  
  FunctionBody::CreateConstantTable(function);
  pWVar2 = (function->m_constTable).ptr;
  uVar5 = FunctionBody::GetCountField(function,ConstantCount);
  type = INT32;
  do {
    this_00 = (AsmJsFunctionInfo *)
              FunctionProxy::GetAuxPtr((FunctionProxy *)function,AsmJsFunctionInfo);
    pTVar7 = AsmJsFunctionInfo::GetTypedSlotInfo(this_00,type);
    uVar1 = pTVar7->constCount;
    if (1 < uVar1) {
      uVar6 = WAsmJs::GetTypeByteSize(type);
      if ((1 < type - FLOAT32) && (type != INT32)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        lineNumber = 0xcee;
LAB_008852f3:
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                    ,lineNumber,"((0))","UNREACHED");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar8 = 0;
        Throw::FatalInternalError(-0x7fffbffb);
      }
      uVar9 = (ulong)uVar6;
      value = (WriteBarrierPtr<void> *)((long)&pWVar2->ptr + pTVar7->constSrcByteOffset + uVar9);
      remainingBytes = this->raw + ((long)this->totalSize - (long)current);
      iVar10 = uVar1 - 1;
      do {
        if (type == FLOAT32) {
          ReadFloat(current,(size_t)remainingBytes,(float *)value);
        }
        else if (type == INT32) {
          ReadConstantSizedInt32(current,(size_t)remainingBytes,(int *)value);
        }
        else {
          ReadDouble(current,(size_t)remainingBytes,(double *)value);
        }
        current = current + uVar9;
        remainingBytes = remainingBytes + -uVar9;
        value = (WriteBarrierPtr<void> *)((long)&value->ptr + uVar9);
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
      if (pWVar2 + uVar5 < value) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        lineNumber = 0xcf9;
        goto LAB_008852f3;
      }
    }
    type = type + INT64;
    if (type == LIMIT) {
      return current;
    }
  } while( true );
}

Assistant:

const byte * ReadAsmJsConstantsTable(const byte * current, FunctionBody * function)
    {
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int constant;
        current = ReadInt32(current, &constant);
        Assert(constant == magicStartOfConstantTable);
#endif

        function->CreateConstantTable();

        auto constTable = function->GetConstTable();
        byte* tableEnd = (byte*)(constTable + function->GetConstantCount());

        for (int i = 0; i < WAsmJs::LIMIT; ++i)
        {
            WAsmJs::Types type = (WAsmJs::Types)i;
            WAsmJs::TypedSlotInfo* typedInfo = function->GetAsmJsFunctionInfo()->GetTypedSlotInfo(type);
            uint32 constCount = typedInfo->constCount;
            if (constCount > FunctionBody::FirstRegSlot)
            {
                uint32 typeSize = WAsmJs::GetTypeByteSize(type);
                byte* byteTable = ((byte*)constTable) + typedInfo->constSrcByteOffset;
                byteTable += typeSize * FunctionBody::FirstRegSlot;

                size_t remainingBytes = (raw + totalSize) - current;
                for (uint32 reg = FunctionBody::FirstRegSlot; reg < constCount; ++reg)
                {
                    switch (type)
                    {
                    case WAsmJs::INT32:   ReadConstantSizedInt32(current, remainingBytes, (int*)byteTable); break;
                    case WAsmJs::FLOAT32: ReadFloat(current, remainingBytes, (float*)byteTable); break;
                    case WAsmJs::FLOAT64: ReadDouble(current, remainingBytes, (double*)byteTable); break;
                    default:
                        Assert(UNREACHED);
                        Js::Throw::FatalInternalError();
                        break;
                    }
                    current += typeSize;
                    byteTable += typeSize;
                    remainingBytes -= typeSize;
                }

                if (byteTable > tableEnd)
                {
                    Assert(UNREACHED);
                    Js::Throw::FatalInternalError();
                }
            }
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        current = ReadInt32(current, &constant);
        Assert(constant == magicEndOfConstantTable);
#endif

        return current;
    }